

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

void ToStringHelper(ON_COMPONENT_INDEX ci,char *buffer,size_t sizeof_buffer)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  char *str;
  TYPE TVar6;
  bool bVar7;
  char ubuffer [32];
  
  if (buffer == (char *)0x0) {
    return;
  }
  uVar3 = (ulong)ci >> 0x20;
  buffer[0x7f] = '\0';
  lVar4 = 0;
  lVar2 = 0;
  do {
    if (0x7e < lVar2) break;
    if ("m_type="[lVar4] != '\0') {
      buffer[lVar2] = "m_type="[lVar4];
      lVar2 = lVar2 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  TVar6 = ci.m_type;
  if ((int)TVar6 < 0x33) {
    switch(TVar6) {
    case invalid_type:
    case brep_trim|brep_edge:
    case brep_trim|brep_face:
    case 8:
    case 9:
    case 10:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
      goto switchD_00564232_caseD_43;
    case brep_vertex:
      pcVar5 = "ON_COMPONENT_INDEX::brep_vertex";
      break;
    case brep_edge:
      pcVar5 = "ON_COMPONENT_INDEX::brep_edge";
      break;
    case brep_face:
      pcVar5 = "ON_COMPONENT_INDEX::brep_face";
      break;
    case brep_trim:
      pcVar5 = "ON_COMPONENT_INDEX::brep_trim";
      break;
    case brep_loop:
      pcVar5 = "ON_COMPONENT_INDEX::brep_loop";
      break;
    case mesh_vertex:
      pcVar5 = "ON_COMPONENT_INDEX::mesh_vertex";
      break;
    case meshtop_vertex:
      pcVar5 = "ON_COMPONENT_INDEX::meshtop_vertex";
      break;
    case meshtop_edge:
      pcVar5 = "ON_COMPONENT_INDEX::meshtop_edge";
      break;
    case mesh_face:
      pcVar5 = "ON_COMPONENT_INDEX::mesh_face";
      break;
    case mesh_ngon:
      pcVar5 = "ON_COMPONENT_INDEX::mesh_ngon";
      break;
    case idef_part:
      pcVar5 = "ON_COMPONENT_INDEX::idef_part";
      break;
    case no_type:
      pcVar5 = "ON_COMPONENT_INDEX::no_type";
      break;
    default:
      if (TVar6 == polycurve_segment) {
        pcVar5 = "ON_COMPONENT_INDEX::polycurve_segment";
      }
      else {
        if (TVar6 != pointcloud_point) goto switchD_00564232_caseD_43;
        pcVar5 = "ON_COMPONENT_INDEX::pointcloud_point";
      }
    }
  }
  else {
    switch(TVar6) {
    case extrusion_bottom_profile:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_bottom_profile";
      break;
    case extrusion_top_profile:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_top_profile";
      break;
    case extrusion_wall_edge:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_wall_edge";
      break;
    case extrusion_wall_surface:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_wall_surface";
      break;
    case extrusion_cap_surface:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_cap_surface";
      break;
    case extrusion_path:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_path";
      break;
    case extrusion_path|brep_vertex:
    case extrusion_wall_surface|brep_trim:
    case extrusion_wall_surface|brep_loop:
    case extrusion_wall_surface|brep_trim|brep_edge:
    case subd_edge|brep_edge:
    case subd_edge|brep_face:
    case subd_edge|brep_trim:
    case subd_edge|brep_loop:
    case subd_edge|brep_trim|brep_edge:
    case subd_edge|brep_trim|brep_face:
    case 0x50:
switchD_00564232_caseD_43:
      bVar7 = true;
      pcVar5 = (char *)0x0;
      goto LAB_005643d4;
    case subd_vertex:
      pcVar5 = "ON_COMPONENT_INDEX::subd_vertex";
      break;
    case subd_edge:
      pcVar5 = "ON_COMPONENT_INDEX::subd_edge";
      break;
    case subd_face:
      pcVar5 = "ON_COMPONENT_INDEX::subd_face";
      break;
    case hatch_loop:
      pcVar5 = "ON_COMPONENT_INDEX::hatch_loop";
      break;
    default:
      switch(TVar6) {
      case dim_linear_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_linear_point";
        break;
      case dim_radial_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_radial_point";
        break;
      case dim_angular_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_angular_point";
        break;
      case dim_ordinate_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_ordinate_point";
        break;
      case dim_text_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_text_point";
        break;
      case dim_centermark_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_centermark_point";
        break;
      case dim_leader_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_leader_point";
        break;
      default:
        if (TVar6 != group_member) goto switchD_00564232_caseD_43;
        pcVar5 = "ON_COMPONENT_INDEX::group_member";
      }
    }
  }
  bVar7 = false;
LAB_005643d4:
  if (!bVar7) {
    do {
      if (0x7e < lVar2) break;
      cVar1 = *pcVar5;
      if (cVar1 != '\0') {
        buffer[lVar2] = cVar1;
        lVar2 = lVar2 + 1;
      }
      pcVar5 = pcVar5 + 1;
    } while (cVar1 != '\0');
  }
  lVar4 = 0;
  do {
    if (0x7e < lVar2) break;
    if (" m_index="[lVar4] != '\0') {
      buffer[lVar2] = " m_index="[lVar4];
      lVar2 = lVar2 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  if (ci.m_index < 1) {
    uVar3 = (ulong)(uint)-ci.m_index;
    lVar4 = 0;
    do {
      if (0x7e < lVar2) break;
      if ("-"[lVar4] != '\0') {
        buffer[lVar2] = "-"[lVar4];
        lVar2 = lVar2 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  pcVar5 = ubuffer + 0x1f;
  ubuffer[0x1f] = '\0';
  lVar4 = -0x1e;
  do {
    pcVar5[-1] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    pcVar5 = pcVar5 + -1;
    if ((uint)uVar3 < 10) break;
    bVar7 = lVar4 != 0;
    uVar3 = uVar3 / 10;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  do {
    if (0x7e < lVar2) {
      return;
    }
    cVar1 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    buffer[lVar2] = cVar1;
    lVar2 = lVar2 + 1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

static void ToStringHelper( ON_COMPONENT_INDEX ci, char* buffer, size_t sizeof_buffer )
{
  char* str = buffer;
  size_t str_capacity = sizeof_buffer/sizeof(buffer[0]);
  const char* s;
  const char* str_end;
  char ubuffer[32]; // unsigned int to string storage ubuffer
  unsigned int i, j;

  if ( nullptr == str || str_capacity <= 0 )
    return;

  str[--str_capacity] = 0;
  if (str_capacity <= 0)
    return;

  str_end = str + str_capacity;

  s = "m_type=";
  while ( str < str_end )
  {
    const char c = *s++;
    if (0 == c)
      break;

    *str++ = c;
  }

  switch(ci.m_type)
  {
  case ON_COMPONENT_INDEX::no_type:            s = "ON_COMPONENT_INDEX::no_type";            break;
  
  case ON_COMPONENT_INDEX::brep_vertex:        s = "ON_COMPONENT_INDEX::brep_vertex";        break;
  case ON_COMPONENT_INDEX::brep_edge:          s = "ON_COMPONENT_INDEX::brep_edge";          break;
  case ON_COMPONENT_INDEX::brep_face:          s = "ON_COMPONENT_INDEX::brep_face";          break;
  case ON_COMPONENT_INDEX::brep_trim:          s = "ON_COMPONENT_INDEX::brep_trim";          break;
  case ON_COMPONENT_INDEX::brep_loop:          s = "ON_COMPONENT_INDEX::brep_loop";          break;
  
  case ON_COMPONENT_INDEX::mesh_vertex:        s = "ON_COMPONENT_INDEX::mesh_vertex";        break;
  case ON_COMPONENT_INDEX::meshtop_vertex:     s = "ON_COMPONENT_INDEX::meshtop_vertex";     break;
  case ON_COMPONENT_INDEX::meshtop_edge:       s = "ON_COMPONENT_INDEX::meshtop_edge";       break;
  case ON_COMPONENT_INDEX::mesh_face:          s = "ON_COMPONENT_INDEX::mesh_face";          break;
  case ON_COMPONENT_INDEX::mesh_ngon:          s = "ON_COMPONENT_INDEX::mesh_ngon";          break;

  case ON_COMPONENT_INDEX::idef_part:          s = "ON_COMPONENT_INDEX::idef_part";          break;
  case ON_COMPONENT_INDEX::polycurve_segment:  s = "ON_COMPONENT_INDEX::polycurve_segment";  break;
  case ON_COMPONENT_INDEX::pointcloud_point:   s = "ON_COMPONENT_INDEX::pointcloud_point";   break;
  case ON_COMPONENT_INDEX::group_member:       s = "ON_COMPONENT_INDEX::group_member";       break;

  case ON_COMPONENT_INDEX::extrusion_bottom_profile: s = "ON_COMPONENT_INDEX::extrusion_bottom_profile"; break;
  case ON_COMPONENT_INDEX::extrusion_top_profile:    s = "ON_COMPONENT_INDEX::extrusion_top_profile";    break;
  case ON_COMPONENT_INDEX::extrusion_wall_edge:      s = "ON_COMPONENT_INDEX::extrusion_wall_edge";      break;
  case ON_COMPONENT_INDEX::extrusion_wall_surface:   s = "ON_COMPONENT_INDEX::extrusion_wall_surface";   break;
  case ON_COMPONENT_INDEX::extrusion_cap_surface:    s = "ON_COMPONENT_INDEX::extrusion_cap_surface";    break;
  case ON_COMPONENT_INDEX::extrusion_path:           s = "ON_COMPONENT_INDEX::extrusion_path";           break;

  case ON_COMPONENT_INDEX::subd_vertex:        s = "ON_COMPONENT_INDEX::subd_vertex";        break;
  case ON_COMPONENT_INDEX::subd_edge:          s = "ON_COMPONENT_INDEX::subd_edge";          break;
  case ON_COMPONENT_INDEX::subd_face:          s = "ON_COMPONENT_INDEX::subd_face";          break;

  case ON_COMPONENT_INDEX::hatch_loop:         s = "ON_COMPONENT_INDEX::hatch_loop";         break;

  case ON_COMPONENT_INDEX::dim_linear_point:   s = "ON_COMPONENT_INDEX::dim_linear_point";   break;
  case ON_COMPONENT_INDEX::dim_radial_point:   s = "ON_COMPONENT_INDEX::dim_radial_point";   break;
  case ON_COMPONENT_INDEX::dim_angular_point:  s = "ON_COMPONENT_INDEX::dim_angular_point";  break;
  case ON_COMPONENT_INDEX::dim_ordinate_point: s = "ON_COMPONENT_INDEX::dim_ordinate_point"; break;
  case ON_COMPONENT_INDEX::dim_text_point:     s = "ON_COMPONENT_INDEX::dim_text_point";     break;
  case ON_COMPONENT_INDEX::dim_centermark_point:     s = "ON_COMPONENT_INDEX::dim_centermark_point";     break;
  case ON_COMPONENT_INDEX::dim_leader_point:         s = "ON_COMPONENT_INDEX::dim_leader_point";         break;

  default: s = 0; break;
  }

  if ( 0 != s )
  {
    while ( str < str_end )
    {
      const char c = *s++;
      if (0 == c)
        break;

      *str++ = c;
    }
  }

  s = " m_index=";
  while ( str < str_end )
  {
    const char c = *s++;
    if (0 == c)
      break;

    *str++ = c;
  }

  if ( ci.m_index < 1 )
  {
    i = (unsigned int)(-ci.m_index);
    s = "-";
    while ( str < str_end )
    {
      const char c = *s++;
      if (0 == c)
        break;

      *str++ = c;
    }
  }
  else
  {
    i = (unsigned int)(ci.m_index);
  }
  
  j = sizeof(ubuffer)/sizeof(ubuffer[0]);
  j--;
  ubuffer[j] = 0;
  while(j > 0)
  {
    j--;
    ubuffer[j] = (char)('0'+i%10);
    i /= 10;
    if ( 0 == i )
      break;
  }

  s = &ubuffer[j];
  while ( str < str_end )
  {
    if ( 0 == (*str++ = *s++))
      break;
  }
}